

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

Instr * __thiscall LowererMD::Simd128LowerLdLane(LowererMD *this,Instr *instr)

{
  IRType type;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  OpCode OVar7;
  uint32 index;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *dstOpnd;
  IntConstOpnd *pIVar10;
  Instr *pIVar11;
  Opnd *pOVar12;
  RegOpnd *pRVar13;
  uint uVar14;
  Func *pFVar15;
  IntConstType local_50;
  OpCode local_34;
  IRType local_31;
  
  this_00 = instr->m_dst;
  pRVar13 = (RegOpnd *)instr->m_src1;
  pIVar10 = (IntConstOpnd *)instr->m_src2;
  if ((this_00 == (Opnd *)0x0) || (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindReg)) {
LAB_0066bd37:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x27f,
                       "(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()))"
                       ,
                       "dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64())"
                      );
    if (!bVar5) goto LAB_0066c7ea;
    *puVar9 = 0;
  }
  else {
    type = this_00->m_type;
    if (((10 < type) || ((0x688U >> (type & 0x1f) & 1) == 0)) &&
       (bVar5 = IRType_IsInt64(type), !bVar5)) goto LAB_0066bd37;
  }
  if (((pRVar13 == (RegOpnd *)0x0) ||
      (OVar4 = IR::Opnd::GetKind((Opnd *)pRVar13), OVar4 != OpndKindReg)) ||
     (bVar5 = IRType_IsSimd128((pRVar13->super_Opnd).m_type), !bVar5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x280,"(src1 && src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1 && src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar5) goto LAB_0066c7ea;
    *puVar9 = 0;
  }
  if ((pIVar10 == (IntConstOpnd *)0x0) ||
     (OVar4 = IR::Opnd::GetKind((Opnd *)pIVar10), OVar4 != OpndKindIntConst)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x281,"(src2 && src2->IsIntConstOpnd())","src2 && src2->IsIntConstOpnd()");
    if (!bVar5) goto LAB_0066c7ea;
    *puVar9 = 0;
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)pIVar10);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) goto LAB_0066c7ea;
    *puVar9 = 0;
  }
  index = IR::IntConstOpnd::AsUint32(pIVar10);
  OVar7 = instr->m_opcode;
  if (OVar7 < Simd128_ExtractLane_U4) {
    if (Simd128_StArrConst_F4 < OVar7) {
      if (OVar7 == Simd128_ExtractLane_I4) goto LAB_0066c03a;
      if (OVar7 != Simd128_ExtractLane_F4) {
        if (OVar7 == Simd128_ExtractLane_I8) goto LAB_0066bfad;
        goto LAB_0066bf53;
      }
      if (index < 4) goto LAB_0066c1ce;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x28d,"(laneIndex < 4)","laneIndex < 4");
      if (!bVar5) goto LAB_0066c7ea;
      local_34 = MOVSS;
      bVar5 = false;
LAB_0066c24f:
      *puVar9 = 0;
      local_31 = TyInt32;
      uVar8 = 0;
      local_50 = 0;
      bVar2 = false;
      bVar3 = false;
      goto LAB_0066c279;
    }
    if (OVar7 != Simd128_ExtractLane_I2) {
      if (OVar7 == Simd128_ExtractLane_I16) goto LAB_0066c085;
LAB_0066bf53:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x2aa,"((0))","UNREACHED");
      if (!bVar5) goto LAB_0066c7ea;
      *puVar9 = 0;
LAB_0066c1ce:
      local_34 = MOVSS;
      bVar3 = false;
      local_31 = TyInt32;
      bVar2 = false;
      local_50 = 0;
      uVar8 = 0;
      bVar5 = false;
      goto LAB_0066c110;
    }
    EmitExtractInt64(this,this_00,instr->m_src1,index,instr);
    local_31 = TyInt32;
    uVar8 = 0;
    local_50 = 0;
    bVar2 = false;
    bVar3 = false;
  }
  else {
    if (OVar7 < Simd128_ExtractLane_B4) {
      if (OVar7 == Simd128_ExtractLane_U4) {
LAB_0066c03a:
        if (index < 4) {
          local_34 = MOVD;
          bVar5 = true;
          bVar3 = false;
          local_31 = TyInt32;
          bVar2 = false;
          local_50 = 0;
          uVar8 = 0;
          goto LAB_0066c110;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x2a7,"(laneIndex < 4)","laneIndex < 4");
        if (!bVar5) goto LAB_0066c7ea;
        bVar5 = true;
        local_34 = MOVD;
        goto LAB_0066c24f;
      }
      if (OVar7 != Simd128_ExtractLane_U8) {
        if (OVar7 != Simd128_ExtractLane_U16) goto LAB_0066bf53;
        goto LAB_0066c085;
      }
LAB_0066bfad:
      if (7 < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x293,"(laneIndex < 8)","laneIndex < 8");
        if (!bVar5) goto LAB_0066c7ea;
        *puVar9 = 0;
      }
      uVar8 = (index & 1) << 4;
      index = index >> 1;
      local_50 = 0xffff;
      local_31 = TyInt16;
      bVar2 = true;
      bVar3 = false;
    }
    else {
      if (OVar7 == Simd128_ExtractLane_B4) goto LAB_0066c03a;
      if (OVar7 == Simd128_ExtractLane_B8) goto LAB_0066bfad;
      if (OVar7 != Simd128_ExtractLane_B16) goto LAB_0066bf53;
LAB_0066c085:
      if (0xf < index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x29d,"(laneIndex < 16)","laneIndex < 16");
        if (!bVar5) goto LAB_0066c7ea;
        *puVar9 = 0;
      }
      uVar8 = index * 8 & 0x18;
      index = index >> 2;
      local_50 = 0xff;
      bVar3 = true;
      bVar2 = false;
      local_31 = TyInt8;
    }
    local_34 = MOVD;
    bVar5 = true;
LAB_0066c110:
    if (index != 0) {
LAB_0066c279:
      dstOpnd = IR::RegOpnd::New((pRVar13->super_Opnd).m_type,this->m_func);
      pIVar10 = IR::IntConstOpnd::New((ulong)(index << 2),TyInt8,this->m_func,true);
      pIVar11 = IR::Instr::New(PSRLDQ,&dstOpnd->super_Opnd,(Opnd *)pRVar13,&pIVar10->super_Opnd,
                               this->m_func);
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      pRVar13 = dstOpnd;
    }
    pOVar12 = this_00;
    if (!bVar5) {
      pOVar12 = IR::Opnd::UseWithNewType(this_00,(pRVar13->super_Opnd).m_type,this->m_func);
    }
    pIVar11 = IR::Instr::New(local_34,pOVar12,&pRVar13->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
  }
  OVar7 = instr->m_opcode;
  if (OVar7 < 0x397) {
    if ((OVar7 == Simd128_ExtractLane_I16) ||
       ((OVar7 == Simd128_ExtractLane_I8 || (OVar7 == Simd128_ExtractLane_U8)))) {
LAB_0066c381:
      if (uVar8 != 0) {
        pIVar10 = IR::IntConstOpnd::New((ulong)uVar8,TyInt8,this->m_func,false);
        pIVar11 = IR::Instr::New(SHR,this_00,this_00,&pIVar10->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar11);
        Legalize<false>(pIVar11,false);
      }
      if (!bVar2 && !bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x2ce,"(laneType == TyInt8 || laneType == TyInt16)",
                           "laneType == TyInt8 || laneType == TyInt16");
        if (!bVar5) goto LAB_0066c7ea;
        *puVar9 = 0;
      }
      if ((instr->m_opcode == Simd128_ExtractLane_I8) ||
         (instr->m_opcode == Simd128_ExtractLane_I16)) {
        if (bVar3) {
          pRVar13 = IR::RegOpnd::New(TyInt8,this->m_func);
          pIVar11 = IR::Instr::New(MOV,&pRVar13->super_Opnd,this_00,this->m_func);
          IR::Instr::InsertBefore(instr,pIVar11);
          Legalize<false>(pIVar11,false);
          pFVar15 = this->m_func;
          OVar7 = MOVSX;
        }
        else {
          pRVar13 = (RegOpnd *)IR::Opnd::UseWithNewType(this_00,local_31,this->m_func);
          pFVar15 = this->m_func;
          OVar7 = MOVSXW;
        }
        pIVar11 = IR::Instr::New(OVar7,this_00,&pRVar13->super_Opnd,pFVar15);
      }
      else {
        pIVar10 = IR::IntConstOpnd::New(local_50,TyInt32,this->m_func,false);
        pIVar11 = IR::Instr::New(AND,this_00,this_00,&pIVar10->super_Opnd,this->m_func);
      }
      IR::Instr::InsertBefore(instr,pIVar11);
      Legalize<false>(pIVar11,false);
      OVar7 = instr->m_opcode;
    }
  }
  else {
    uVar14 = OVar7 - 0x397;
    if ((uVar14 < 0x39) && ((0x100400000000001U >> ((ulong)uVar14 & 0x3f) & 1) != 0))
    goto LAB_0066c381;
  }
  if ((OVar7 - 0x3bb < 0x15) && ((0x100401U >> (OVar7 - 0x3bb & 0x1f) & 1) != 0)) {
    pRVar13 = IR::RegOpnd::New(TyInt8,this->m_func);
    pIVar11 = IR::Instr::New(CMP,this->m_func);
    pOVar12 = IR::Opnd::UseWithNewType(this_00,local_31,this->m_func);
    if (pIVar11->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_0066c7ea;
      *puVar9 = 0;
    }
    pFVar15 = pIVar11->m_func;
    if (pOVar12->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_0066c7ea;
      *puVar9 = 0;
    }
    bVar6 = pOVar12->field_0xb;
    if ((bVar6 & 2) != 0) {
      pOVar12 = IR::Opnd::Copy(pOVar12,pFVar15);
      bVar6 = pOVar12->field_0xb;
    }
    pOVar12->field_0xb = bVar6 | 2;
    pIVar11->m_src1 = pOVar12;
    pIVar10 = IR::IntConstOpnd::New(0,local_31,this->m_func,true);
    if (pIVar11->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_0066c7ea;
      *puVar9 = 0;
    }
    pFVar15 = pIVar11->m_func;
    if ((pIVar10->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) {
LAB_0066c7ea:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar9 = 0;
    }
    bVar6 = (pIVar10->super_Opnd).field_0xb;
    if ((bVar6 & 2) != 0) {
      pIVar10 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar10->super_Opnd,pFVar15);
      bVar6 = (pIVar10->super_Opnd).field_0xb;
    }
    (pIVar10->super_Opnd).field_0xb = bVar6 | 2;
    pIVar11->m_src2 = &pIVar10->super_Opnd;
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(MOV,&pRVar13->super_Opnd,this_00,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(SETNE,&pRVar13->super_Opnd,&pRVar13->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
    Legalize<false>(pIVar11,false);
    pIVar11 = IR::Instr::New(MOVSX,this_00,&pRVar13->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar11);
  }
  pIVar11 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar11;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLdLane(IR::Instr *instr)
{
    IR::Opnd* dst, *src1, *src2;
    Js::OpCode movOpcode = Js::OpCode::MOVSS;
    uint laneWidth = 0, laneIndex = 0, shamt = 0, mask = 0;
    IRType laneType = TyInt32;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();
    src2 = instr->GetSrc2();

    Assert(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()));
    Assert(src1 && src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2 && src2->IsIntConstOpnd());


    laneIndex = (uint)src2->AsIntConstOpnd()->AsUint32();
    laneWidth = 4;
    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_ExtractLane_I2:
        laneWidth = 8;
        break;
    case Js::OpCode::Simd128_ExtractLane_F4:
        movOpcode = Js::OpCode::MOVSS;
        Assert(laneIndex < 4);
        break;
    case Js::OpCode::Simd128_ExtractLane_I8:
    case Js::OpCode::Simd128_ExtractLane_U8:
    case Js::OpCode::Simd128_ExtractLane_B8:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 8);
        shamt = (laneIndex % 2) * 16;
        laneIndex = laneIndex / 2;
        laneType = TyInt16;
        mask = 0x0000ffff;
        break;
    case Js::OpCode::Simd128_ExtractLane_I16:
    case Js::OpCode::Simd128_ExtractLane_U16:
    case Js::OpCode::Simd128_ExtractLane_B16:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 16);
        shamt = (laneIndex % 4) * 8;
        laneIndex = laneIndex / 4;
        laneType = TyInt8;
        mask = 0x000000ff;
        break;
    case Js::OpCode::Simd128_ExtractLane_U4:
    case Js::OpCode::Simd128_ExtractLane_I4:
    case Js::OpCode::Simd128_ExtractLane_B4:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 4);
        break;
    default:
        Assert(UNREACHED);
    }

    if (laneWidth == 8) //Simd128_ExtractLane_I2
    {
        EmitExtractInt64(dst, instr->GetSrc1(), laneIndex, instr);
    }
    else
    {
        IR::Opnd* tmp = src1;
        if (laneIndex != 0)
        {
            // tmp = PSRLDQ src1, shamt
            tmp = IR::RegOpnd::New(src1->GetType(), m_func);
            IR::Instr *shiftInstr = IR::Instr::New(Js::OpCode::PSRLDQ, tmp, src1, IR::IntConstOpnd::New(laneWidth * laneIndex, TyInt8, m_func, true), m_func);
            instr->InsertBefore(shiftInstr);
            Legalize(shiftInstr);
        }
        // MOVSS/MOVSD/MOVD dst, tmp
        instr->InsertBefore(IR::Instr::New(movOpcode, movOpcode == Js::OpCode::MOVD ? dst : dst->UseWithNewType(tmp->GetType(), m_func), tmp, m_func));
    }

    // dst has the 4-byte lane
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        // extract the 1/2 bytes sublane
        IR::Instr *newInstr = nullptr;
        if (shamt != 0)
        {
            // SHR dst, dst, shamt
            newInstr = IR::Instr::New(Js::OpCode::SHR, dst, dst, IR::IntConstOpnd::New((IntConstType)shamt, TyInt8, m_func), m_func);
            instr->InsertBefore(newInstr);
            Legalize(newInstr);
        }

        Assert(laneType == TyInt8 || laneType == TyInt16);
        // zero or sign-extend upper bits
        if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16)
        {
            if (laneType == TyInt8)
            {
                IR::RegOpnd * tmp = IR::RegOpnd::New(TyInt8, m_func);
                newInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
                instr->InsertBefore(newInstr);
                Legalize(newInstr);
                newInstr = IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func);
            }
            else
            {
                newInstr = IR::Instr::New(Js::OpCode::MOVSXW, dst, dst->UseWithNewType(laneType, m_func), m_func);
            }
        }
        else
        {
            newInstr = IR::Instr::New(Js::OpCode::AND, dst, dst, IR::IntConstOpnd::New(mask, TyInt32, m_func), m_func);
        }

        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        IR::Instr* pInstr = nullptr;
        IR::RegOpnd* tmp = IR::RegOpnd::New(TyInt8, m_func);

        // cmp      dst, 0
        pInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
        pInstr->SetSrc1(dst->UseWithNewType(laneType, m_func));
        pInstr->SetSrc2(IR::IntConstOpnd::New(0, laneType, m_func, true));
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // mov     tmp(TyInt8), dst
        pInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // setne     tmp(TyInt8)
        pInstr = IR::Instr::New(Js::OpCode::SETNE, tmp, tmp, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // movsx      dst, tmp(TyInt8)
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func));
    }

    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}